

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UCharsTrieElement::compareStringTo
          (UCharsTrieElement *this,UCharsTrieElement *other,UnicodeString *strings)

{
  byte bVar1;
  int srcStart;
  int srcLength;
  UnicodeString local_90;
  UnicodeString local_50;
  
  getString(&local_50,this,strings);
  getString(&local_90,other,strings);
  if ((local_90.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
    if (-1 < local_90.fUnion.fStackFields.fLengthAndFlags) {
      local_90.fUnion.fFields.fLength = (int)local_90.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    srcStart = 0;
    if (local_90.fUnion.fFields.fLength < 0) {
      srcStart = local_90.fUnion.fFields.fLength;
    }
    srcLength = local_90.fUnion.fFields.fLength - srcStart;
    if (local_90.fUnion.fFields.fLength <= local_90.fUnion.fFields.fLength - srcStart) {
      srcLength = local_90.fUnion.fFields.fLength;
    }
    if (local_90.fUnion.fFields.fLength < 0) {
      srcLength = 0;
    }
    if (-1 < local_50.fUnion.fStackFields.fLengthAndFlags) {
      local_50.fUnion.fFields.fLength = (int)local_50.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if ((local_90.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
      local_90.fUnion.fFields.fArray = local_90.fUnion.fStackFields.fBuffer;
    }
    bVar1 = UnicodeString::doCompare
                      (&local_50,0,local_50.fUnion.fFields.fLength,local_90.fUnion.fFields.fArray,
                       srcStart,srcLength);
  }
  else {
    bVar1 = ~(byte)local_50.fUnion.fStackFields.fLengthAndFlags & 1;
  }
  UnicodeString::~UnicodeString(&local_90);
  UnicodeString::~UnicodeString(&local_50);
  return (int)(char)bVar1;
}

Assistant:

int32_t
UCharsTrieElement::compareStringTo(const UCharsTrieElement &other, const UnicodeString &strings) const {
    return getString(strings).compare(other.getString(strings));
}